

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator*=(TPZFMatrix<long> *this,long value)

{
  long *plVar1;
  int64_t iVar2;
  int64_t iVar3;
  long in_RSI;
  TPZFMatrix<long> *in_RDI;
  long *dstlast;
  long *dst;
  int64_t size;
  long *local_20;
  
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  plVar1 = in_RDI->fElem;
  local_20 = plVar1;
  while (local_20 < plVar1 + iVar2 * iVar3) {
    *local_20 = in_RSI * *local_20;
    local_20 = local_20 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}